

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

bool __thiscall
cmFileInstaller::InstallFile
          (cmFileInstaller *this,string *fromFile,string *toFile,MatchProperties match_properties)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Status SVar4;
  pointer pcVar5;
  byte unaff_BPL;
  bool bVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string newFromFile;
  string reassembled;
  string toDir;
  string e;
  string oldSymlinkTarget;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [32];
  char *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined8 local_80;
  char *local_78;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  if (this->InstallMode == COPY) {
    bVar6 = cmFileCopier::InstallFile(&this->super_cmFileCopier,fromFile,toFile,match_properties);
    return bVar6;
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  if (this->InstallMode - REL_SYMLINK < 4) {
    cmsys::SystemTools::GetParentDirectory(&local_f0,toFile);
    cmSystemTools::ForceToRelativePath((string *)local_b0,&local_f0,fromFile);
    std::__cxx11::string::operator=((string *)&local_130,(string *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    cmsys::SystemTools::CollapseFullPath(&local_110,&local_130,&local_f0);
    bVar2 = cmsys::SystemTools::ComparePath(&local_110,fromFile);
    bVar6 = true;
    if (!bVar2) {
      if (this->InstallMode - SYMLINK < 2) {
        std::__cxx11::string::_M_assign((string *)&local_130);
      }
      else if (this->InstallMode == REL_SYMLINK_OR_COPY) {
        unaff_BPL = cmFileCopier::InstallFile
                              (&this->super_cmFileCopier,fromFile,toFile,match_properties);
        bVar6 = false;
      }
      else {
        pcVar1 = (this->super_cmFileCopier).Name;
        local_b0._0_8_ = strlen(pcVar1);
        local_b0._16_8_ = 0x30;
        local_b0._24_8_ = " cannot determine relative path for symlink to \"";
        local_90 = (char *)local_130._M_string_length;
        local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_130._M_dataplus._M_p;
        local_80 = 6;
        local_78 = "\" at \"";
        local_68 = (toFile->_M_dataplus)._M_p;
        local_70 = toFile->_M_string_length;
        local_60 = 2;
        local_58 = "\".";
        views._M_len = 6;
        views._M_array = (iterator)local_b0;
        local_b0._8_8_ = pcVar1;
        cmCatViews_abi_cxx11_(&local_d0,views);
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar6 = false;
        unaff_BPL = 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar6) goto LAB_004210e3;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_130);
  }
  bVar6 = true;
  if ((this->super_cmFileCopier).Always == false) {
    local_b0._8_8_ = (char *)0x0;
    local_b0._16_8_ = local_b0._16_8_ & 0xffffffffffffff00;
    local_b0._0_8_ = local_b0 + 0x10;
    SVar4 = cmsys::SystemTools::ReadSymlink(toFile,(string *)local_b0);
    bVar6 = true;
    if ((SVar4.Kind_ == Success) && (local_130._M_string_length == local_b0._8_8_)) {
      if ((char *)local_130._M_string_length == (char *)0x0) {
        bVar6 = false;
      }
      else {
        iVar3 = bcmp(local_130._M_dataplus._M_p,(void *)local_b0._0_8_,local_130._M_string_length);
        bVar6 = iVar3 != 0;
      }
    }
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
  }
  (*(this->super_cmFileCopier)._vptr_cmFileCopier[5])(this,toFile,2,(ulong)bVar6);
  unaff_BPL = 1;
  if (bVar6 != false) {
    cmsys::SystemTools::RemoveFile(toFile);
    cmsys::SystemTools::GetFilenamePath((string *)local_b0,toFile);
    cmsys::SystemTools::MakeDirectory((string *)local_b0,(mode_t *)0x0);
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    SVar4 = cmSystemTools::CreateSymlink(&local_130,toFile);
    if (SVar4.Kind_ != Success) {
      if ((this->InstallMode < (SYMLINK_OR_COPY|ABS_SYMLINK)) &&
         ((0x54U >> (this->InstallMode & 0x1f) & 1) != 0)) {
        unaff_BPL = cmFileCopier::InstallFile
                              (&this->super_cmFileCopier,&local_130,toFile,match_properties);
      }
      else {
        pcVar1 = (this->super_cmFileCopier).Name;
        pcVar5 = (pointer)strlen(pcVar1);
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        local_b0._16_8_ = 0x1b;
        local_b0._24_8_ = " cannot create symlink to \"";
        local_90 = (char *)local_130._M_string_length;
        local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_130._M_dataplus._M_p;
        local_80 = 6;
        local_78 = "\" at \"";
        local_68 = (toFile->_M_dataplus)._M_p;
        local_70 = toFile->_M_string_length;
        local_60 = 3;
        local_58 = "\": ";
        local_50 = local_110._M_string_length;
        local_48 = local_110._M_dataplus._M_p;
        local_40 = 2;
        local_38 = "\".";
        views_00._M_len = 8;
        views_00._M_array = (iterator)local_b0;
        local_b0._0_8_ = pcVar5;
        local_b0._8_8_ = pcVar1;
        cmCatViews_abi_cxx11_(&local_f0,views_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        unaff_BPL = 0;
      }
    }
  }
LAB_004210e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool cmFileInstaller::InstallFile(const std::string& fromFile,
                                  const std::string& toFile,
                                  MatchProperties match_properties)
{
  if (this->InstallMode == cmInstallMode::COPY) {
    return this->cmFileCopier::InstallFile(fromFile, toFile, match_properties);
  }

  std::string newFromFile;

  if (this->InstallMode == cmInstallMode::REL_SYMLINK ||
      this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
      this->InstallMode == cmInstallMode::SYMLINK ||
      this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
    // Try to get a relative path.
    std::string toDir = cmSystemTools::GetParentDirectory(toFile);
    newFromFile = cmSystemTools::ForceToRelativePath(toDir, fromFile);

    // Double check that we can restore the original path.
    std::string reassembled =
      cmSystemTools::CollapseFullPath(newFromFile, toDir);
    if (!cmSystemTools::ComparePath(reassembled, fromFile)) {
      if (this->InstallMode == cmInstallMode::SYMLINK ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // User does not mind, silently proceed with absolute path.
        newFromFile = fromFile;
      } else if (this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY) {
        // User expects a relative symbolic link or a copy.
        // Since an absolute symlink won't do, copy instead.
        return this->cmFileCopier::InstallFile(fromFile, toFile,
                                               match_properties);
      } else {
        // We cannot meet user's expectation (REL_SYMLINK)
        auto e = cmStrCat(this->Name,
                          " cannot determine relative path for symlink to \"",
                          newFromFile, "\" at \"", toFile, "\".");
        this->Status.SetError(e);
        return false;
      }
    }
  } else {
    newFromFile = fromFile; // stick with absolute path
  }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if (!this->Always) {
    std::string oldSymlinkTarget;
    if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
      if (newFromFile == oldSymlinkTarget) {
        copy = false;
      }
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if (copy) {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create destination directory if it doesn't exist
    cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(toFile));

    // Create the symlink.
    if (!cmSystemTools::CreateSymlink(newFromFile, toFile)) {
      if (this->InstallMode == cmInstallMode::ABS_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // Failed to create a symbolic link, fall back to copying.
        return this->cmFileCopier::InstallFile(newFromFile, toFile,
                                               match_properties);
      }

      auto e = cmStrCat(this->Name, " cannot create symlink to \"",
                        newFromFile, "\" at \"", toFile,
                        "\": ", cmSystemTools::GetLastSystemError(), "\".");
      this->Status.SetError(e);
      return false;
    }
  }

  return true;
}